

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O1

void __thiscall QGraphicsWidget::adjustSize(QGraphicsWidget *this)

{
  QSizeF QVar1;
  long in_FS_OFFSET;
  QSizeF QVar2;
  QSizeF local_38;
  QSizeF local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.ht = -1.0;
  local_38.wd = -1.0;
  QVar2 = QGraphicsLayoutItem::effectiveSizeHint
                    ((QGraphicsLayoutItem *)(this + 0x20),PreferredSize,&local_38);
  QVar1.ht = local_28.ht;
  QVar1.wd = local_28.wd;
  if ((0.0 <= QVar2.wd) && (local_28 = QVar1, 0.0 <= QVar2.ht)) {
    local_38 = (QSizeF)QGraphicsItem::pos((QGraphicsItem *)(this + 0x10));
    local_28 = QVar2;
    (**(code **)(*(long *)this + 0x60))(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::adjustSize()
{
    QSizeF sz = effectiveSizeHint(Qt::PreferredSize);
    // What if sz is not valid?!
    if (sz.isValid())
        resize(sz);
}